

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_info_get_valuelen_
               (MPIABI_Fint *info,char *key,int *valuelen,int *flag,MPIABI_Fint *ierror,
               size_t key_len)

{
  size_t key_len_local;
  MPIABI_Fint *ierror_local;
  int *flag_local;
  int *valuelen_local;
  char *key_local;
  MPIABI_Fint *info_local;
  
  mpi_info_get_valuelen_(info,key,valuelen,flag,ierror,key_len);
  return;
}

Assistant:

void mpiabi_info_get_valuelen_(
  const MPIABI_Fint * info,
  const char * key,
  int * valuelen,
  int * flag,
  MPIABI_Fint * ierror,
  size_t key_len
) {
  return mpi_info_get_valuelen_(
    info,
    key,
    valuelen,
    flag,
    ierror,
    key_len
  );
}